

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

void Wlc_NtkPrintNode(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  FILE *__stream;
  ushort uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  int *piVar6;
  Wlc_Obj_t *pWVar7;
  char *pcVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  int k;
  char *pcVar12;
  
  lVar5 = (long)pObj - (long)p->pObjs;
  printf("%8d  :  ",lVar5 / 0x18 & 0xffffffff,lVar5 % 0x18);
  if ((p->vLevels).nSize != 0) {
    uVar2 = Vec_IntEntry(&p->vLevels,(int)(((long)pObj - (long)p->pObjs) / 0x18));
    printf("Lev = %2d  ",(ulong)uVar2);
  }
  iVar3 = pObj->End - pObj->Beg;
  iVar9 = -iVar3;
  if (0 < iVar3) {
    iVar9 = iVar3;
  }
  pcVar11 = " ";
  pcVar12 = "s";
  pcVar8 = "s";
  if ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x40) == (undefined1  [24])0x0)
  {
    pcVar8 = " ";
  }
  printf("%6d%s = ",(ulong)(iVar9 + 1),pcVar8);
  uVar1 = *(ushort *)pObj & 0x3f;
  if (uVar1 == 6) {
LAB_0030bf32:
    pcVar8 = "                                ";
  }
  else {
    if (uVar1 == 3) {
      pcVar8 = Wlc_ObjName(p,(int)(((long)pObj - (long)p->pObjs) / 0x18));
      pWVar7 = Wlc_ObjFo2Fi(p,pObj);
      pcVar11 = Wlc_ObjName(p,(int)(((long)pWVar7 - (long)p->pObjs) / 0x18));
      printf("            FO                   :    %-12s = %-12s\n",pcVar8,pcVar11);
      return;
    }
    if (uVar1 == 1) {
      pcVar8 = Wlc_ObjName(p,(int)(((long)pObj - (long)p->pObjs) / 0x18));
      pcVar11 = "            PI                   :    %-12s\n";
LAB_0030c131:
      printf(pcVar11,pcVar8);
      return;
    }
    if (pObj->nFanins == 0) {
      pcVar8 = Wlc_ObjName(p,(int)(((long)pObj - (long)p->pObjs) / 0x18));
      pcVar11 = "Unknown object without fanins    :    %-12s\n";
      goto LAB_0030c131;
    }
    if (uVar1 == 6) goto LAB_0030bf32;
    pWVar7 = Wlc_ObjFanin0(p,pObj);
    iVar3 = pWVar7->End - pWVar7->Beg;
    iVar9 = -iVar3;
    if (0 < iVar3) {
      iVar9 = iVar3;
    }
    pWVar7 = Wlc_ObjFanin0(p,pObj);
    pcVar8 = "s";
    if ((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x40) ==
        (undefined1  [24])0x0) {
      pcVar8 = " ";
    }
    printf("%6d%s  %5s  ",(ulong)(iVar9 + 1),pcVar8,Wlc_Names[*(ushort *)pObj & 0x3f]);
    if ((int)pObj->nFanins < 2) {
      printf("        ");
    }
    else {
      pWVar7 = Wlc_ObjFanin1(p,pObj);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar9 = -iVar3;
      if (0 < iVar3) {
        iVar9 = iVar3;
      }
      pWVar7 = Wlc_ObjFanin1(p,pObj);
      pcVar8 = "s";
      if ((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x40) ==
          (undefined1  [24])0x0) {
        pcVar8 = " ";
      }
      printf("%6d%s ",(ulong)(iVar9 + 1),pcVar8);
    }
    if (2 < (int)pObj->nFanins) {
      pWVar7 = Wlc_ObjFanin2(p,pObj);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar9 = -iVar3;
      if (0 < iVar3) {
        iVar9 = iVar3;
      }
      pWVar7 = Wlc_ObjFanin2(p,pObj);
      if ((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x40) !=
          (undefined1  [24])0x0) {
        pcVar11 = "s";
      }
      printf("%6d%s ",(ulong)(iVar9 + 1),pcVar11);
      goto LAB_0030bf40;
    }
    pcVar8 = "        ";
  }
  printf(pcVar8);
LAB_0030bf40:
  printf(" :    ");
  pcVar8 = Wlc_ObjName(p,(int)(((long)pObj - (long)p->pObjs) / 0x18));
  printf("%-12s",pcVar8);
  if ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) == (undefined1  [24])0x6)
  {
    iVar3 = pObj->End - pObj->Beg;
    iVar9 = -iVar3;
    if (0 < iVar3) {
      iVar9 = iVar3;
    }
    if ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x40) ==
        (undefined1  [24])0x0) {
      pcVar12 = "";
    }
    uVar2 = 0;
    printf(" = %d\'%sh",(ulong)(iVar9 + 1),pcVar12);
    __stream = _stdout;
    if ((pObj->field_0x1 & 8) == 0) {
      piVar6 = Wlc_ObjConstValue(pObj);
      iVar3 = pObj->End - pObj->Beg;
      iVar9 = -iVar3;
      if (0 < iVar3) {
        iVar9 = iVar3;
      }
      uVar2 = iVar9 + 4U >> 2;
      iVar9 = pObj->Beg - pObj->End;
      if (iVar9 <= iVar3) {
        iVar9 = iVar3;
      }
      uVar10 = iVar9 + 4U & 0xfffffffc;
      while (uVar10 = uVar10 - 4, 0 < (int)uVar2) {
        uVar2 = uVar2 - 1;
        uVar4 = (uint)(*(ulong *)(piVar6 + (ulong)(uVar2 >> 4) * 2) >> ((byte)uVar10 & 0x3c)) & 0xf;
        iVar9 = uVar4 + 0x30;
        if (9 < uVar4) {
          iVar9 = uVar4 + 0x57;
        }
        fputc(iVar9,__stream);
      }
    }
    else {
      while( true ) {
        iVar3 = pObj->End - pObj->Beg;
        iVar9 = -iVar3;
        if (0 < iVar3) {
          iVar9 = iVar3;
        }
        if (iVar9 + 4U >> 2 <= uVar2) break;
        putchar(0x78);
        uVar2 = uVar2 + 1;
      }
    }
  }
  else {
    piVar6 = Wlc_ObjFanins(pObj);
    pcVar8 = Wlc_ObjName(p,*piVar6);
    printf(" =  %-12s  %5s  ",pcVar8,Wlc_Names[*(ushort *)pObj & 0x3f]);
    if ((int)pObj->nFanins < 2) {
      printf("             ");
    }
    else {
      piVar6 = Wlc_ObjFanins(pObj);
      pcVar8 = Wlc_ObjName(p,piVar6[1]);
      printf("%-12s ",pcVar8);
    }
    if (2 < (int)pObj->nFanins) {
      piVar6 = Wlc_ObjFanins(pObj);
      pcVar8 = Wlc_ObjName(p,piVar6[2]);
      printf("%-12s ",pcVar8);
    }
  }
  putchar(10);
  return;
}

Assistant:

void Wlc_NtkPrintNode( Wlc_Ntk_t * p, Wlc_Obj_t * pObj )
{
    printf( "%8d  :  ", Wlc_ObjId(p, pObj) );
    if ( Vec_IntSize(&p->vLevels) )
        printf( "Lev = %2d  ", Vec_IntEntry(&p->vLevels, Wlc_ObjId(p,pObj)) );
    printf( "%6d%s = ", Wlc_ObjRange(pObj), Wlc_ObjIsSigned(pObj) ? "s" : " " );
    if ( pObj->Type == WLC_OBJ_PI )
    {
        printf( "            PI                   :    %-12s\n", Wlc_ObjName(p, Wlc_ObjId(p, pObj)) );
        return;
    }
    if ( pObj->Type == WLC_OBJ_FO )
    {
        printf( "            FO                   :    %-12s = %-12s\n", Wlc_ObjName(p, Wlc_ObjId(p, pObj)), Wlc_ObjName(p, Wlc_ObjId(p, Wlc_ObjFo2Fi(p, pObj))) );
        return;
    }
    if ( pObj->Type != WLC_OBJ_CONST && Wlc_ObjFaninNum(pObj) == 0 )
    {
        printf( "Unknown object without fanins    :    %-12s\n", Wlc_ObjName(p, Wlc_ObjId(p, pObj)) );
        return;
    }
    if ( pObj->Type != WLC_OBJ_CONST )
    {
        printf( "%6d%s  %5s  ",  Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Wlc_ObjIsSigned(Wlc_ObjFanin0(p, pObj)) ? "s" : " ", Wlc_Names[(int)pObj->Type] );
        if ( Wlc_ObjFaninNum(pObj) > 1 )
            printf( "%6d%s ",       Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)), Wlc_ObjIsSigned(Wlc_ObjFanin1(p, pObj)) ? "s" : " " );
        else
            printf( "        " );
        if ( Wlc_ObjFaninNum(pObj) > 2 )
            printf( "%6d%s ",       Wlc_ObjRange(Wlc_ObjFanin2(p, pObj)), Wlc_ObjIsSigned(Wlc_ObjFanin2(p, pObj)) ? "s" : " " );
        else
            printf( "        " );
    }
    else
        printf( "                                " );
    printf( " :    " );
    printf( "%-12s",   Wlc_ObjName(p, Wlc_ObjId(p, pObj)) );
    if ( pObj->Type == WLC_OBJ_CONST )
    {
        printf( " = %d\'%sh", Wlc_ObjRange(pObj), Wlc_ObjIsSigned(pObj) ? "s":"" );
        if ( pObj->fXConst )
        {
            int k;
            for ( k = 0; k < (Wlc_ObjRange(pObj) + 3) / 4; k++ )
                printf( "x" );
        }
        else
            Abc_TtPrintHexArrayRev( stdout, (word *)Wlc_ObjConstValue(pObj), (Wlc_ObjRange(pObj) + 3) / 4 );
    }
    else
    {
        printf( " =  %-12s  %5s  ", Wlc_ObjName(p, Wlc_ObjFaninId0(pObj)), Wlc_Names[(int)pObj->Type] );
        if ( Wlc_ObjFaninNum(pObj) > 1 )
            printf( "%-12s ",       Wlc_ObjName(p, Wlc_ObjFaninId1(pObj)) );
        else
            printf( "             " );
        if ( Wlc_ObjFaninNum(pObj) > 2 )
            printf( "%-12s ",       Wlc_ObjName(p, Wlc_ObjFaninId2(pObj)) );
    }
    printf( "\n" );
}